

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-util.c
# Opt level: O0

uint32_t read_le32(uchar **buffer)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  uint32_t result;
  uint8_t b4;
  uint8_t b3;
  uint8_t b2;
  uint8_t b1;
  uchar **buffer_local;
  
  uVar1 = **buffer;
  uVar2 = (*buffer)[1];
  uVar3 = (*buffer)[2];
  uVar4 = (*buffer)[3];
  *buffer = *buffer + 4;
  return CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

uint32_t read_le32(unsigned char **buffer)
{
	uint8_t b1, b2, b3, b4;
	b1 = *(uint8_t *)(*buffer);
	b2 = *(uint8_t *)(*buffer + 1);
	b3 = *(uint8_t *)(*buffer + 2);
	b4 = *(uint8_t *)(*buffer + 3);
	uint32_t result = (b1 << 0) | (b2 << 8) | (b3 << 16) | (b4 << 24);
	(*buffer) += 4;
	return result;
}